

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

property_ptr __thiscall
dtc::fdt::property::parse_dtb(property *this,input_buffer *structs,input_buffer *strings)

{
  property *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  property_ptr pVar3;
  shared_ptr<dtc::fdt::property> local_48 [2];
  undefined1 local_21;
  input_buffer *local_20;
  input_buffer *strings_local;
  input_buffer *structs_local;
  property_ptr *p;
  
  local_21 = 0;
  local_20 = strings;
  strings_local = structs;
  structs_local = (input_buffer *)this;
  this_00 = (property *)operator_new(0x78);
  property(this_00,strings_local,local_20);
  std::shared_ptr<dtc::fdt::property>::shared_ptr<dtc::fdt::property,void>
            ((shared_ptr<dtc::fdt::property> *)this,this_00);
  peVar1 = std::__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  _Var2._M_pi = extraout_RDX;
  if ((peVar1->valid & 1U) == 0) {
    std::shared_ptr<dtc::fdt::property>::shared_ptr(local_48,(nullptr_t)0x0);
    std::shared_ptr<dtc::fdt::property>::operator=((shared_ptr<dtc::fdt::property> *)this,local_48);
    std::shared_ptr<dtc::fdt::property>::~shared_ptr(local_48);
    _Var2._M_pi = extraout_RDX_00;
  }
  pVar3.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  pVar3.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (property_ptr)pVar3.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

property_ptr
property::parse_dtb(input_buffer &structs, input_buffer &strings)
{
	property_ptr p(new property(structs, strings));
	if (!p->valid)
	{
		p = nullptr;
	}
	return p;
}